

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void internal_counters_gga_prev
               (xc_dimensions *dim,int offset,double **rho,double **sigma,double **zk,double **vrho,
               double **vsigma,double **v2rho2,double **v2rhosigma,double **v2sigma2,double **v3rho3
               ,double **v3rho2sigma,double **v3rhosigma2,double **v3sigma3,double **v4rho4,
               double **v4rho3sigma,double **v4rho2sigma2,double **v4rhosigma3,double **v4sigma4)

{
  long *in_RCX;
  double **in_RDX;
  int in_ESI;
  xc_dimensions *in_RDI;
  double **in_R8;
  double **in_R9;
  long *in_stack_00000008;
  double **in_stack_00000010;
  double **in_stack_00000048;
  
  internal_counters_lda_prev
            (in_RDI,in_ESI,in_RDX,in_R8,in_R9,in_stack_00000010,sigma,in_stack_00000048);
  if (*in_RCX != 0) {
    *in_RCX = *in_RCX + (long)(in_RDI->sigma + in_ESI) * -8;
  }
  if (*in_R9 != (double *)0x0) {
    *in_stack_00000008 = *in_stack_00000008 + (long)(in_RDI->vsigma + in_ESI) * -8;
  }
  if (*in_stack_00000010 != (double *)0x0) {
    *vrho = *vrho + -(long)(in_RDI->v2rhosigma + in_ESI);
    *zk = *zk + -(long)(in_RDI->v2sigma2 + in_ESI);
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_gga_prev
(const xc_dimensions *dim, int offset, const double **rho, const double **sigma,
 double **zk GGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  internal_counters_lda_prev(dim, offset, rho, zk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, ));

  if(*sigma != NULL) *sigma -= dim->sigma  + offset;
#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL) *vsigma -= dim->vsigma + offset;
#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) {
    *v2rhosigma -= dim->v2rhosigma + offset;
    *v2sigma2   -= dim->v2sigma2  + offset;
  }
#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) {
    *v3rho2sigma -= dim->v3rho2sigma + offset;
    *v3rhosigma2 -= dim->v3rhosigma2 + offset;
    *v3sigma3    -= dim->v3sigma3    + offset;
  }
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) {
    *v4rho3sigma  -= dim->v4rho3sigma  + offset;
    *v4rho2sigma2 -= dim->v4rho2sigma2 + offset;
    *v4rhosigma3  -= dim->v4rhosigma3  + offset;
    *v4sigma4     -= dim->v4sigma4     + offset;
  }
#endif
#endif
#endif
#endif
}